

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button.c
# Opt level: O0

void resize_helper(natwm_state *state,int16_t offset_x,int16_t offset_y)

{
  undefined8 in_R8;
  undefined8 in_R9;
  undefined4 local_34;
  undefined4 local_30;
  xcb_configure_window_value_list_t values;
  uint16_t mask;
  int16_t offset_y_local;
  int16_t offset_x_local;
  natwm_state *state_local;
  
  if (state->button_state->resize_helper != 0) {
    values.sibling._2_2_ = 0xc;
    local_34 = 0;
    local_30 = 0;
    values.x = (uint)(state->button_state->grabbed_client->rect).width + (int)offset_x;
    values.y = (uint)(state->button_state->grabbed_client->rect).height + (int)offset_y;
    values.width = 0;
    values.height = 0;
    values.border_width = 0;
    values.stack_mode._0_2_ = offset_y;
    values.stack_mode._2_2_ = offset_x;
    xcb_configure_window_aux
              (state->xcb,state->button_state->resize_helper,0xc,&local_34,in_R8,in_R9,0x105a2f);
  }
  return;
}

Assistant:

static void resize_helper(const struct natwm_state *state, int16_t offset_x, int16_t offset_y)
{
        if (state->button_state->resize_helper == XCB_NONE) {
                return;
        }

        uint16_t mask = XCB_CONFIG_WINDOW_WIDTH | XCB_CONFIG_WINDOW_HEIGHT;
        xcb_configure_window_value_list_t values = {
                .width = (uint32_t)(state->button_state->grabbed_client->rect.width + offset_x),
                .height = (uint32_t)(state->button_state->grabbed_client->rect.height + offset_y),
        };

        xcb_configure_window_aux(state->xcb, state->button_state->resize_helper, mask, &values);
}